

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-cpu.cpp
# Opt level: O3

_Bool ggml_backend_cpu_device_supports_buft(ggml_backend_dev_t dev,ggml_backend_buffer_type_t buft)

{
  char cVar1;
  bool bVar2;
  pointer ppgVar3;
  pointer ppgVar4;
  
  cVar1 = ggml_backend_buft_is_host(buft);
  bVar2 = true;
  if (cVar1 == '\0') {
    ggml_backend_cpu_get_extra_buffers_type();
    ppgVar4 = ggml_backend_cpu_get_extra_buffers_type::bufts.
              super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if (ggml_backend_cpu_get_extra_buffers_type::bufts.
        super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>.
        _M_impl.super__Vector_impl_data._M_start ==
        ggml_backend_cpu_get_extra_buffers_type::bufts.
        super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>.
        _M_impl.super__Vector_impl_data._M_finish) {
      bVar2 = false;
    }
    else {
      do {
        ppgVar3 = ppgVar4 + 1;
        bVar2 = *ppgVar4 == buft && *ppgVar4 != (ggml_backend_buffer_type *)0x0;
        if (bVar2) {
          return bVar2;
        }
        ppgVar4 = ppgVar3;
      } while (ppgVar3 !=
               ggml_backend_cpu_get_extra_buffers_type::bufts.
               super__Vector_base<ggml_backend_buffer_type_*,_std::allocator<ggml_backend_buffer_type_*>_>
               ._M_impl.super__Vector_impl_data._M_finish);
    }
  }
  return bVar2;
}

Assistant:

static bool ggml_backend_cpu_device_supports_buft(ggml_backend_dev_t dev, ggml_backend_buffer_type_t buft) {
    return ggml_backend_buft_is_host(buft) || ggml_backend_cpu_is_extra_buffer_type(buft);
    GGML_UNUSED(dev);
}